

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::VariableDeclStatement::evalImpl(VariableDeclStatement *this,EvalContext *context)

{
  bool bVar1;
  EvalContext *this_00;
  ConstantValue *in_RSI;
  ValueSymbol *in_RDI;
  Expression *initializer;
  ConstantValue initial;
  ConstantValue *in_stack_fffffffffffffec8;
  EvalContext *in_stack_fffffffffffffed0;
  Type *in_stack_fffffffffffffed8;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  EvalContext *in_stack_ffffffffffffff18;
  SourceRange in_stack_ffffffffffffff20;
  DiagCode in_stack_ffffffffffffff34;
  ER local_4;
  
  slang::ConstantValue::ConstantValue((ConstantValue *)0x87ffa1);
  this_00 = (EvalContext *)ValueSymbol::getInitializer((ValueSymbol *)0x87ffaf);
  if (this_00 != (EvalContext *)0x0) {
    if ((*(int *)&(in_RDI->super_Symbol).parentScope[6].compilation != 1) ||
       (in_stack_ffffffffffffff07 = Expression::bad((Expression *)in_stack_fffffffffffffed0),
       (bool)in_stack_ffffffffffffff07)) {
      Expression::eval((Expression *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x8800b0);
      in_stack_ffffffffffffff06 =
           slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8800ba);
      if (!(bool)in_stack_ffffffffffffff06) {
        local_4 = Fail;
        goto LAB_008801cf;
      }
    }
    else {
      EvalContext::addDiag
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff34,in_stack_ffffffffffffff20);
    }
  }
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x8800f6);
  if (!bVar1) {
    ValueSymbol::getType((ValueSymbol *)0x880114);
    Type::getDefaultValue(in_stack_fffffffffffffed8);
    slang::ConstantValue::operator=
              ((ConstantValue *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x880148);
  }
  slang::ConstantValue::ConstantValue(in_RSI,in_stack_fffffffffffffec8);
  EvalContext::createLocal
            (this_00,in_RDI,
             (ConstantValue *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x880197);
  local_4 = Success;
LAB_008801cf:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x8801dc);
  return local_4;
}

Assistant:

ER VariableDeclStatement::evalImpl(EvalContext& context) const {
    // Figure out the initial value for the variable.
    ConstantValue initial;
    if (auto initializer = symbol.getInitializer()) {
        // Initialization of static variables is skipped in constant functions.
        // This is confusing so issue a warning.
        if (symbol.lifetime == VariableLifetime::Static && !initializer->bad()) {
            context.addDiag(diag::ConstEvalStaticSkipped, initializer->sourceRange);
        }
        else {
            initial = initializer->eval(context);
            if (!initial)
                return ER::Fail;
        }
    }

    if (!initial)
        initial = symbol.getType().getDefaultValue();

    // Create storage for the variable.
    context.createLocal(&symbol, initial);
    return ER::Success;
}